

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall
QMenuSloppyState::setSubMenuPopup
          (QMenuSloppyState *this,QRect *actionRect,QAction *resetAction,QMenu *subMenu)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar6;
  QObject *pQVar4;
  Data *pDVar5;
  Data *pDVar7;
  
  this->m_init_guard = true;
  this->field_0x6c = this->field_0x6c | 0x21;
  QBasicTimer::stop();
  iVar1 = (actionRect->x2).m_i;
  iVar2 = (actionRect->y2).m_i;
  uVar3 = actionRect->x1;
  uVar6 = actionRect->y1;
  (this->m_action_rect).xp = (double)(int)uVar3;
  (this->m_action_rect).yp = (double)(int)uVar6;
  (this->m_action_rect).w = (double)(((long)iVar1 - (long)(int)uVar3) + 1);
  (this->m_action_rect).h = (double)(((long)iVar2 - (long)(int)uVar6) + 1);
  pDVar7 = (this->m_sub_menu).wp.d;
  if ((pDVar7 != (Data *)0x0) &&
     (pQVar4 = (this->m_sub_menu).wp.value, pQVar4 != (QObject *)0x0 && *(int *)(pDVar7 + 4) != 0))
  {
    *(undefined8 *)(*(long *)(pQVar4 + 8) + 0x380) = 0;
  }
  if (subMenu == (QMenu *)0x0) {
    pDVar7 = (Data *)0x0;
  }
  else {
    pDVar7 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)subMenu);
  }
  pDVar5 = (this->m_sub_menu).wp.d;
  (this->m_sub_menu).wp.d = pDVar7;
  (this->m_sub_menu).wp.value = (QObject *)subMenu;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar5 = *(int *)pDVar5 + -1;
    UNLOCK();
    if (*(int *)pDVar5 == 0) {
      operator_delete(pDVar5);
    }
  }
  *(QMenuSloppyState **)(*(long *)&(subMenu->super_QWidget).field_0x8 + 0x380) = this;
  this->m_reset_action = resetAction;
  this->m_origin_action = resetAction;
  return;
}

Assistant:

void QMenuSloppyState::setSubMenuPopup(const QRect &actionRect, QAction *resetAction, QMenu *subMenu)
{
    m_enabled = true;
    m_init_guard = true;
    m_use_reset_action = true;
    m_time.stop();
    m_action_rect = actionRect;
    if (m_sub_menu)
        QMenuPrivate::get(m_sub_menu)->sloppyState.m_parent = nullptr;
    m_sub_menu = subMenu;
    QMenuPrivate::get(subMenu)->sloppyState.m_parent = this;
    m_reset_action = resetAction;
    m_origin_action = resetAction;
}